

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathEuler.h
# Opt level: O1

Matrix33<float> * __thiscall
Imath_3_2::Euler<float>::toMatrix33(Matrix33<float> *__return_storage_ptr__,Euler<float> *this)

{
  byte bVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  bVar1 = this->field_0xc;
  uVar7 = bVar1 >> 3 & 3;
  if ((bVar1 & 4) == 0) {
    uVar5 = 2;
    if ((char)uVar7 != '\0') {
      uVar5 = uVar7 - 1;
    }
  }
  else {
    uVar5 = (uVar7 + 1) % 3;
  }
  if ((bVar1 & 4) == 0) {
    uVar6 = (uVar7 + 1) % 3;
  }
  else {
    uVar6 = 2;
    if ((char)uVar7 != '\0') {
      uVar6 = uVar7 - 1;
    }
  }
  fVar13 = (&(this->super_Vec3<float>).x)[(ulong)(bVar1 & 1) * 2];
  fVar12 = (this->super_Vec3<float>).y;
  fVar11 = (&(this->super_Vec3<float>).x)[(ulong)((byte)~bVar1 & 1) * 2];
  if ((bVar1 & 4) == 0) {
    fVar11 = -fVar11;
    fVar12 = -fVar12;
    fVar13 = -fVar13;
  }
  fVar8 = cosf(fVar11);
  fVar9 = cosf(fVar12);
  fVar10 = cosf(fVar13);
  fVar11 = sinf(fVar11);
  fVar12 = sinf(fVar12);
  fVar13 = sinf(fVar13);
  fVar14 = fVar8 * fVar10;
  fVar16 = fVar8 * fVar13;
  fVar15 = fVar10 * fVar11;
  fVar17 = fVar11 * fVar13;
  *(float *)((long)(__return_storage_ptr__->x + 0) + 0) = 1.0;
  *(float *)((long)(__return_storage_ptr__->x + 0) + 4) = 0.0;
  *(undefined8 *)(__return_storage_ptr__->x[0] + 2) = 0;
  *(float *)((long)(__return_storage_ptr__->x + 1) + 4) = 1.0;
  *(float *)((long)(__return_storage_ptr__->x + 1) + 8) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 2) + 0) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 2) + 4) = 0.0;
  __return_storage_ptr__->x[2][2] = 1.0;
  if ((this->field_0xc & 2) == 0) {
    uVar2 = (ulong)(uVar7 << 2);
    *(float *)((long)__return_storage_ptr__->x[uVar7] + uVar2) = fVar10 * fVar9;
    lVar3 = (long)(int)uVar5;
    *(float *)((long)__return_storage_ptr__->x[lVar3] + uVar2) = fVar12 * fVar15 - fVar16;
    lVar4 = (long)(int)uVar6;
    *(float *)((long)__return_storage_ptr__->x[lVar4] + uVar2) = fVar12 * fVar14 + fVar17;
    __return_storage_ptr__->x[uVar7][lVar3] = fVar13 * fVar9;
    *(float *)((long)__return_storage_ptr__->x + lVar3 * 0x10) = fVar17 * fVar12 + fVar14;
    __return_storage_ptr__->x[lVar4][lVar3] = fVar12 * fVar16 - fVar15;
    __return_storage_ptr__->x[uVar7][lVar4] = -fVar12;
    __return_storage_ptr__->x[lVar3][lVar4] = fVar11 * fVar9;
    *(float *)((long)__return_storage_ptr__->x + lVar4 * 0x10) = fVar8 * fVar9;
  }
  else {
    uVar2 = (ulong)(uVar7 << 2);
    *(float *)((long)__return_storage_ptr__->x[uVar7] + uVar2) = fVar9;
    lVar4 = (long)(int)uVar5;
    *(float *)((long)__return_storage_ptr__->x[lVar4] + uVar2) = fVar11 * fVar12;
    lVar3 = (long)(int)uVar6;
    *(float *)((long)__return_storage_ptr__->x[lVar3] + uVar2) = fVar8 * fVar12;
    __return_storage_ptr__->x[uVar7][lVar4] = fVar13 * fVar12;
    *(float *)((long)__return_storage_ptr__->x + lVar4 * 0x10) = fVar14 - fVar9 * fVar17;
    __return_storage_ptr__->x[lVar3][lVar4] = -fVar9 * fVar16 - fVar15;
    __return_storage_ptr__->x[uVar7][lVar3] = fVar10 * -fVar12;
    __return_storage_ptr__->x[lVar4][lVar3] = fVar15 * fVar9 + fVar16;
    *(float *)((long)__return_storage_ptr__->x + lVar3 * 0x10) = fVar9 * fVar14 - fVar17;
  }
  return __return_storage_ptr__;
}

Assistant:

IMATH_HOSTDEVICE Matrix33<T>
                 Euler<T>::toMatrix33 () const IMATH_NOEXCEPT
{
    int i, j, k;
    angleOrder (i, j, k);

    Vec3<T> angles;

    if (_frameStatic)
        angles = (*this);
    else
        angles = Vec3<T> (z, y, x);

    if (!_parityEven) angles *= -1.0;

    T ci = std::cos (angles.x);
    T cj = std::cos (angles.y);
    T ch = std::cos (angles.z);
    T si = std::sin (angles.x);
    T sj = std::sin (angles.y);
    T sh = std::sin (angles.z);

    T cc = ci * ch;
    T cs = ci * sh;
    T sc = si * ch;
    T ss = si * sh;

    Matrix33<T> M;

    if (_initialRepeated)
    {
        M[i][i] = cj;
        M[j][i] = sj * si;
        M[k][i] = sj * ci;
        M[i][j] = sj * sh;
        M[j][j] = -cj * ss + cc;
        M[k][j] = -cj * cs - sc;
        M[i][k] = -sj * ch;
        M[j][k] = cj * sc + cs;
        M[k][k] = cj * cc - ss;
    }
    else
    {
        M[i][i] = cj * ch;
        M[j][i] = sj * sc - cs;
        M[k][i] = sj * cc + ss;
        M[i][j] = cj * sh;
        M[j][j] = sj * ss + cc;
        M[k][j] = sj * cs - sc;
        M[i][k] = -sj;
        M[j][k] = cj * si;
        M[k][k] = cj * ci;
    }

    return M;
}